

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  cmCPackLog *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  string *str;
  char *local_440;
  string local_410 [32];
  undefined1 local_3f0 [8];
  ostringstream cmCPackLog_msg_1;
  cmAlphaNum local_278;
  cmAlphaNum local_248;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1c9;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  char *local_20;
  char *name_local;
  cmCPackGenerator *this_local;
  string *ffile;
  
  local_20 = name;
  name_local = (char *)this;
  this_local = (cmCPackGenerator *)__return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar3 = std::operator<<((ostream *)local_198,"Look for template: ");
  if (local_20 == (char *)0x0) {
    local_440 = "(NULL)";
  }
  else {
    local_440 = local_20;
  }
  poVar3 = std::operator<<(poVar3,local_440);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x531,pcVar4);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  pcVar4 = local_20;
  local_1c9 = 0;
  this_00 = this->MakefileMap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar4,&local_1f1);
  cmMakefile::GetModulesFile(__return_storage_ptr__,this_00,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    str = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmAlphaNum::cmAlphaNum(&local_248,str);
    cmAlphaNum::cmAlphaNum(&local_278,"/Modules/Internal/CPack/");
    cmStrCat<char_const*>(&local_218,&local_248,&local_278,&local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
    bVar2 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (!bVar2) {
      std::__cxx11::string::clear();
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  poVar3 = std::operator<<((ostream *)local_3f0,"Found template: ");
  poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x53e,pcVar4);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for template: " << (name ? name : "(NULL)")
                                      << std::endl);
  // Search CMAKE_MODULE_PATH for a custom template.
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  if (ffile.empty()) {
    // Fall back to our internal builtin default.
    ffile = cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/Internal/CPack/",
                     name);
    cmSystemTools::ConvertToUnixSlashes(ffile);
    if (!cmSystemTools::FileExists(ffile)) {
      ffile.clear();
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Found template: " << ffile << std::endl);
  return ffile;
}